

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

Symbol * __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::createPort
          (NonAnsiPortListBuilder *this,string_view externalName,SourceLocation externalLoc,
          PortReferenceSyntax *syntax)

{
  EqualsValueClauseSyntax *pEVar1;
  LookupLocation lookupLocation;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  string_view arg;
  string_view arg_00;
  SyntaxNode *pSVar2;
  bool bVar3;
  SymbolIndex index;
  undefined8 *puVar4;
  PortSymbol *pPVar5;
  Type *newType;
  pointer ppVar6;
  DeclaratorSyntax *pDVar7;
  PortSymbol *pPVar8;
  ExpressionSyntax *syntax_01;
  SourceLocation loc_00;
  SourceLocation in_RCX;
  SyntaxNode *in_RDX;
  size_t in_RSI;
  undefined8 *in_RDI;
  SyntaxNode *in_R8;
  iterator sourceRange;
  EqualsValueClauseSyntax *init;
  PortSymbol *port;
  InterfacePortSymbol *port_2;
  Diagnostic *diag;
  SourceLocation loc;
  PortInfo *info;
  PortSymbol *port_1;
  iterator it;
  string_view name;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd88;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
  *in_stack_fffffffffffffd90;
  group15<boost::unordered::detail::foa::plain_integral> *in_stack_fffffffffffffd98;
  Token *in_stack_fffffffffffffda0;
  Scope *scope_;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffda8;
  Symbol *symbol;
  BumpAllocator *in_stack_fffffffffffffdb0;
  Compilation *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdb8;
  BumpAllocator *in_stack_fffffffffffffdc0;
  __extent_storage<18446744073709551615UL> this_01;
  Diagnostic *in_stack_fffffffffffffdd0;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffdd8;
  SyntaxNode *in_stack_fffffffffffffde0;
  Scope *in_stack_fffffffffffffe30;
  SourceLocation in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  DiagCode code;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  char_pointer puVar9;
  DiagCode code_00;
  string_view local_110;
  SyntaxNode *local_100;
  SourceLocation local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  PortSymbol *local_d8;
  SyntaxNode *local_d0;
  undefined8 *local_c8;
  char_pointer local_c0;
  table_element_pointer local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>
  local_b0;
  SyntaxNode *local_98;
  undefined8 *local_90;
  iterator local_88;
  size_t local_78;
  SyntaxNode *local_70;
  undefined8 *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  SyntaxNode *local_10;
  undefined8 *local_8;
  
  local_100 = in_R8;
  local_f0 = in_RCX;
  local_e8._M_len = in_RSI;
  local_e8._M_str = (char *)in_RDX;
  local_110 = parsing::Token::valueText(in_stack_fffffffffffffda0);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_e8);
  if ((bVar3) && (local_100[1].previewNode == (SyntaxNode *)0x0)) {
    local_e8._M_len = local_110._M_len;
    local_e8._M_str = local_110._M_str;
  }
  puVar4 = in_RDI + 0x5d;
  local_d0 = (SyntaxNode *)&local_110;
  local_c8 = puVar4;
  local_98 = local_d0;
  local_90 = puVar4;
  local_70 = local_d0;
  local_68 = puVar4;
  local_78 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
             ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                       (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  pSVar2 = local_70;
  local_18 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
             ::position_for(in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
  local_10 = pSVar2;
  local_20 = local_78;
  local_8 = puVar4;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
  while( true ) {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
               ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                         *)0x6c83d1);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match(in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90);
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                 ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                             *)0x6c8420);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffdd8 =
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                     *)0x6c8470);
        in_stack_fffffffffffffde0 = local_10;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                    *)0x6c849d);
        bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffda0);
        code = SUB84((ulong)in_stack_fffffffffffffe40 >> 0x20,0);
        if (bVar3) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>
          ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
          goto LAB_006c8591;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffd90,(size_t)in_stack_fffffffffffffd88);
    code = SUB84((ulong)in_stack_fffffffffffffe40 >> 0x20,0);
    if (bVar3) break;
    bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_30,in_RDI[0x5f]);
    code = SUB84((ulong)in_stack_fffffffffffffe40 >> 0x20,0);
    if (!bVar3) {
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>
      ::table_locator(&local_b0);
LAB_006c8591:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                 ::make_iterator((locator *)0x6c859e);
      local_c0 = local_88.pc_;
      local_b8 = local_88.p_;
      puVar9 = local_88.pc_;
      sourceRange = boost::unordered::
                    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                    ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                           *)0x6c8603);
      code_00 = SUB84((ulong)puVar9 >> 0x20,0);
      bVar3 = boost::unordered::detail::foa::operator==
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffd90,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffd88);
      if (bVar3) {
        bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_110);
        if (!bVar3) {
          Scope::addDiag(in_stack_fffffffffffffe30,code,in_stack_fffffffffffffe38);
          arg._M_str = (char *)in_stack_fffffffffffffde0;
          arg._M_len = (size_t)in_stack_fffffffffffffdd8;
          Diagnostic::operator<<(in_stack_fffffffffffffdd0,arg);
        }
        pPVar5 = BumpAllocator::
                 emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                           (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                            (SourceLocation *)in_stack_fffffffffffffdb0,
                            (bool *)in_stack_fffffffffffffda8);
        pPVar8 = pPVar5;
        newType = Compilation::getErrorType((Compilation *)*in_RDI);
        PortSymbol::setType(pPVar8,newType);
        local_d8 = pPVar5;
      }
      else {
        ppVar6 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffffd90);
        (ppVar6->second).used = true;
        pDVar7 = not_null<const_slang::syntax::DeclaratorSyntax_*>::operator->
                           ((not_null<const_slang::syntax::DeclaratorSyntax_*> *)0x6c875a);
        parsing::Token::location(&pDVar7->name);
        if (((ppVar6->second).isIface & 1U) == 0) {
          pPVar8 = BumpAllocator::
                   emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                             (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                              (SourceLocation *)in_stack_fffffffffffffdb0,
                              (bool *)in_stack_fffffffffffffda8);
          Symbol::setSyntax(&pPVar8->super_Symbol,local_100);
          pPVar8->externalLoc = local_f0;
          pPVar8->direction = (ppVar6->second).direction;
          pPVar8->internalSymbol = (ppVar6->second).internalSymbol;
          pDVar7 = not_null<const_slang::syntax::DeclaratorSyntax_*>::operator->
                             ((not_null<const_slang::syntax::DeclaratorSyntax_*> *)0x6c8a79);
          pEVar1 = pDVar7->initializer;
          local_d8 = pPVar8;
          if (pEVar1 != (EqualsValueClauseSyntax *)0x0) {
            syntax_01 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                                  ((not_null<slang::syntax::ExpressionSyntax_*> *)0x6c8aae);
            loc_00 = parsing::Token::location(&pEVar1->equals);
            PortSymbol::setInitializerSyntax(pPVar8,syntax_01,loc_00);
          }
        }
        else {
          bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_e8);
          if (bVar3) {
            local_e8._M_len = local_110._M_len;
            local_e8._M_str = local_110._M_str;
          }
          if (local_100[1].previewNode != (SyntaxNode *)0x0) {
            slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffde0);
            Scope::addDiag((Scope *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                           code_00,(SourceRange)sourceRange);
            arg_00._M_str = (char *)in_stack_fffffffffffffde0;
            arg_00._M_len = (size_t)in_stack_fffffffffffffdd8;
            Diagnostic::operator<<(in_stack_fffffffffffffdd0,arg_00);
          }
          pPVar8 = (PortSymbol *)
                   BumpAllocator::
                   emplace<slang::ast::InterfacePortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>
                             (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                              (SourceLocation *)in_stack_fffffffffffffda0);
          this_01._M_extent_value = (size_t)pPVar8;
          pDVar7 = not_null<const_slang::syntax::DeclaratorSyntax_*>::operator*
                             ((not_null<const_slang::syntax::DeclaratorSyntax_*> *)0x6c88a7);
          Symbol::setSyntax((Symbol *)this_01._M_extent_value,&pDVar7->super_SyntaxNode);
          pPVar8->internalSymbol = &((ppVar6->second).ifaceDef)->super_Symbol;
          pPVar8->externalLoc = (SourceLocation)(ppVar6->second).modport._M_len;
          *(char **)&pPVar8->direction = (ppVar6->second).modport._M_str;
          local_d8 = pPVar8;
          if ((ppVar6->second).insertionPoint != (Symbol *)0x0) {
            this_00 = (Compilation *)*in_RDI;
            symbol = (Symbol *)in_RDI[1];
            scope_ = (Scope *)in_RDI[1];
            index = Symbol::getIndex((ppVar6->second).insertionPoint);
            LookupLocation::LookupLocation((LookupLocation *)&stack0xfffffffffffffe28,scope_,index);
            syntax_00._M_extent._M_extent_value = this_01._M_extent_value;
            syntax_00._M_ptr = (pointer)pPVar8;
            lookupLocation._8_8_ = this_00;
            lookupLocation.scope = (Scope *)symbol;
            AttributeSymbol::fromSyntax(syntax_00,scope_,lookupLocation);
            attributes._M_extent._M_extent_value = this_01._M_extent_value;
            attributes._M_ptr = (pointer)pPVar8;
            Compilation::setAttributes(this_00,symbol,attributes);
          }
        }
      }
      return &local_d8->super_Symbol;
    }
  }
  memset(&local_b0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>
  ::table_locator(&local_b0);
  goto LAB_006c8591;
}

Assistant:

Symbol& createPort(std::string_view externalName, SourceLocation externalLoc,
                       const PortReferenceSyntax& syntax) {
        auto name = syntax.name.valueText();
        if (externalName.empty() && !syntax.select)
            externalName = name;

        auto it = portInfos.find(name);
        if (it == portInfos.end()) {
            if (!name.empty())
                scope.addDiag(diag::MissingPortIODeclaration, externalLoc) << name;

            auto port = comp.emplace<PortSymbol>(externalName, externalLoc, /* isAnsiPort */ false);
            port->setType(comp.getErrorType());
            return *port;
        }

        auto& info = it->second;
        info.used = true;

        auto loc = info.syntax->name.location();
        if (info.isIface) {
            // Interface ports should not have empty names. We'll be ignoring the
            // select if there is one (along with issuing an error) so just set the name.
            if (externalName.empty())
                externalName = name;

            if (syntax.select) {
                auto& diag = scope.addDiag(diag::IfacePortInExpr, syntax.select->sourceRange());
                diag << externalName;
            }

            auto port = comp.emplace<InterfacePortSymbol>(externalName, loc);
            port->setSyntax(*info.syntax);
            port->interfaceDef = info.ifaceDef;
            port->modport = info.modport;

            if (info.insertionPoint) {
                comp.setAttributes(
                    *port, AttributeSymbol::fromSyntax(
                               info.attrs, scope,
                               LookupLocation(&scope, (uint32_t)info.insertionPoint->getIndex())));
            }

            return *port;
        }

        auto port = comp.emplace<PortSymbol>(externalName, loc, /* isAnsiPort */ false);
        port->setSyntax(syntax);
        port->externalLoc = externalLoc;

        SLANG_ASSERT(info.internalSymbol);
        port->direction = info.direction;
        port->internalSymbol = info.internalSymbol;

        if (auto init = info.syntax->initializer)
            port->setInitializerSyntax(*init->expr, init->equals.location());

        return *port;
    }